

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imreadwrite.cpp
# Opt level: O2

Mat * cv::imread(Mat *__return_storage_ptr__,string *path,int flags)

{
  uchar uVar1;
  int *piVar2;
  uchar *p;
  stbi_uc *__ptr;
  uchar *puVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int c;
  int h;
  int w;
  Mat img;
  
  if (flags == -1) {
    iVar4 = 0;
  }
  else if (flags == 0) {
    iVar4 = 1;
  }
  else {
    if (flags != 1) goto LAB_00135255;
    iVar4 = 3;
  }
  __ptr = stbi_load((path->_M_dataplus)._M_p,&w,&h,&c,iVar4);
  if (__ptr == (stbi_uc *)0x0) {
LAB_00135255:
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    __return_storage_ptr__->cols = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->data = (uchar *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    return __return_storage_ptr__;
  }
  if (flags != -1) {
    c = iVar4;
  }
  img.rows = 0;
  img.cols = 0;
  img.c = 0;
  img.data = (uchar *)0x0;
  img.refcount._0_4_ = 0;
  img.refcount._4_4_ = 0;
  if (c == 4) {
    Mat::create(&img,h,w,4);
  }
  else if (c == 3) {
    Mat::create(&img,h,w,3);
  }
  else {
    if (c != 1) {
      free(__ptr);
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      __return_storage_ptr__->cols = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->data = (uchar *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      goto LAB_001353a9;
    }
    Mat::create(&img,h,w,1);
  }
  memcpy(img.data,__ptr,(long)c * (long)h * (long)w);
  free(__ptr);
  if (c == 3) {
    puVar3 = img.data;
    iVar4 = 0;
    if (0 < h * w) {
      iVar4 = h * w;
    }
    while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
      uVar1 = *puVar3;
      *puVar3 = puVar3[2];
      puVar3[2] = uVar1;
      puVar3 = puVar3 + 3;
    }
  }
  if (c == 4) {
    iVar4 = h * w;
    lVar5 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != (int)lVar5; lVar5 = lVar5 + 1) {
      uVar1 = img.data[lVar5 * 4];
      img.data[lVar5 * 4] = img.data[lVar5 * 4 + 2];
      img.data[lVar5 * 4 + 2] = uVar1;
    }
  }
  __return_storage_ptr__->data = img.data;
  piVar2 = (int *)CONCAT44(img.refcount._4_4_,img.refcount._0_4_);
  __return_storage_ptr__->refcount = piVar2;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  __return_storage_ptr__->rows = img.rows;
  __return_storage_ptr__->cols = img.cols;
  __return_storage_ptr__->c = img.c;
LAB_001353a9:
  Mat::~Mat(&img);
  return __return_storage_ptr__;
}

Assistant:

Mat imread(const std::string& path, int flags)
{
    int desired_channels = 0;
    if (flags == IMREAD_UNCHANGED)
    {
        desired_channels = 0;
    }
    else if (flags == IMREAD_GRAYSCALE)
    {
        desired_channels = 1;
    }
    else if (flags == IMREAD_COLOR)
    {
        desired_channels = 3;
    }
    else
    {
        // unknown flags
        return Mat();
    }

    int w;
    int h;
    int c;
    unsigned char* pixeldata = stbi_load(path.c_str(), &w, &h, &c, desired_channels);
    if (!pixeldata)
    {
        // load failed
        return Mat();
    }

    if (desired_channels)
    {
        c = desired_channels;
    }

    // copy pixeldata to Mat
    Mat img;
    if (c == 1)
    {
        img.create(h, w, CV_8UC1);
    }
    else if (c == 3)
    {
        img.create(h, w, CV_8UC3);
    }
    else if (c == 4)
    {
        img.create(h, w, CV_8UC4);
    }
    else
    {
        // unexpected channels
        stbi_image_free(pixeldata);
        return Mat();
    }

    memcpy(img.data, pixeldata, static_cast<size_t>(w) * static_cast<size_t>(h) * static_cast<size_t>(c));

    stbi_image_free(pixeldata);

    //     // resolve exif orientation
    //     {
    //         std::ifstream ifs;
    //         ifs.open(filename.c_str(), std::ifstream::in);
    //
    //         if (ifs.good())
    //         {
    //             ExifReader exif_reader(ifs);
    //             if (exif_reader.parse())
    //             {
    //                 ExifEntry_t e = exif_reader.getTag(ORIENTATION);
    //                 int orientation = e.field_u16;
    //                 if (orientation >= 1 && orientation <= 8)
    //                     rotate_by_orientation(img, img, orientation);
    //             }
    //         }
    //
    //         ifs.close();
    //     }

    // rgb to bgr
    if (c == 3)
    {
        uchar* p = img.data;
        for (int i = 0; i < w * h; i++)
        {
            std::swap(p[0], p[2]);
            p += 3;
        }
    }
    if (c == 4)
    {
        uchar* p = img.data;
        for (int i = 0; i < w * h; i++)
        {
            std::swap(p[0], p[2]);
            p += 4;
        }
    }

    return img;
}